

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.hpp
# Opt level: O3

DAM * __thiscall Doublet::amlist(DAM *__return_storage_ptr__,Doublet *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  pointer pcVar8;
  size_type *local_48;
  size_type local_40;
  size_type local_38;
  undefined8 uStack_30;
  
  iVar2 = (this->left).ijk._M_elems[1];
  iVar3 = (this->right).ijk._M_elems[1];
  iVar4 = (this->left).ijk._M_elems[0];
  iVar5 = (this->left).ijk._M_elems[2];
  iVar6 = (this->right).ijk._M_elems[0];
  iVar7 = (this->right).ijk._M_elems[2];
  pcVar8 = (this->tag)._M_dataplus._M_p;
  local_48 = &local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar8,pcVar8 + (this->tag)._M_string_length);
  (__return_storage_ptr__->dam)._M_elems[0] = iVar2 + iVar4 + iVar5;
  (__return_storage_ptr__->dam)._M_elems[1] = iVar3 + iVar6 + iVar7;
  paVar1 = &(__return_storage_ptr__->tag).field_2;
  (__return_storage_ptr__->tag)._M_dataplus._M_p = (pointer)paVar1;
  if (local_48 == &local_38) {
    paVar1->_M_allocated_capacity = local_38;
    *(undefined8 *)((long)&(__return_storage_ptr__->tag).field_2 + 8) = uStack_30;
  }
  else {
    (__return_storage_ptr__->tag)._M_dataplus._M_p = (pointer)local_48;
    (__return_storage_ptr__->tag).field_2._M_allocated_capacity = local_38;
  }
  (__return_storage_ptr__->tag)._M_string_length = local_40;
  return __return_storage_ptr__;
}

Assistant:

int am(void) const { return ijk[0] + ijk[1] + ijk[2]; }